

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q5.cpp
# Opt level: O0

pair<char,_char> sum(char c1,char c2,char carry)

{
  int local_34;
  int local_30;
  char local_29;
  int local_28;
  char local_21;
  int local_20;
  int local_1c;
  int carried_int_sum;
  int int_sum;
  int dc2;
  int dc1;
  char carry_local;
  char c2_local;
  char c1_local;
  
  dc2._3_1_ = carry;
  dc1._0_1_ = c2;
  dc1._1_1_ = c1;
  int_sum = distance(c1);
  carried_int_sum = distance((char)dc1);
  local_1c = int_sum + carried_int_sum;
  local_34 = local_1c;
  if (dc2._3_1_ == '1') {
    local_34 = local_1c + 1;
  }
  local_20 = local_34;
  if (local_34 < 10) {
    local_21 = '0';
    local_28 = local_34 + 0x30;
    std::pair<char,_char>::pair<char,_int,_true>
              ((pair<char,_char> *)((long)&dc1 + 2),&local_21,&local_28);
  }
  else {
    local_29 = '1';
    local_30 = local_34 + 0x26;
    std::pair<char,_char>::pair<char,_int,_true>
              ((pair<char,_char> *)((long)&dc1 + 2),&local_29,&local_30);
  }
  return dc1._2_2_;
}

Assistant:

std::pair<char, char> sum(const char c1, const char c2, const char carry){
  // distances from offset char
  auto dc1             {distance(c1)};
  auto dc2             {distance(c2)};
  // sum of distances
  auto int_sum         {dc1 + dc2};
  // sum of distances considering carry
  auto carried_int_sum {carry == '1' ? int_sum + 1 : int_sum};
    
  // if sum with carry is at most nine, carry '0'
  if (carried_int_sum <= 9){
    return {'0', base_digit + carried_int_sum};
  }
  // otherwise, carry '1' and subtract ten to obtain result digit
  else{
    return {'1', base_digit + carried_int_sum - 10};
  }
}